

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint8x16OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDUint8x16Operation::OpShiftRightByScalar(SIMDValue *value,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  
  auVar2 = pshufb(ZEXT416(0xff >> (sbyte)(count & 7U)),(undefined1  [16])0x0);
  uVar3 = (ulong)(count & 7U);
  auVar1._0_2_ = (value->field_0).u16[0] >> uVar3;
  auVar1._2_2_ = (value->field_0).u16[1] >> uVar3;
  auVar1._4_2_ = (value->field_0).u16[2] >> uVar3;
  auVar1._6_2_ = (value->field_0).u16[3] >> uVar3;
  auVar1._8_2_ = (value->field_0).u16[4] >> uVar3;
  auVar1._10_2_ = (value->field_0).u16[5] >> uVar3;
  auVar1._12_2_ = (value->field_0).u16[6] >> uVar3;
  auVar1._14_2_ = (value->field_0).u16[7] >> uVar3;
  return (SIMDValue)(anon_union_16_9_4d7543c8_for__SIMDValue_0)(auVar1 & auVar2);
}

Assistant:

SIMDValue SIMDUint8x16Operation::OpShiftRightByScalar(const SIMDValue& value, int count)
    {
        X86SIMDValue x86Result = { { 0, 0, 0, 0} };
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(value);
        __m128i x86tmp1;

        count = count & SIMDUtils::SIMDGetShiftAmountMask(1);

       __m128i mask = _mm_set1_epi8((unsigned char)0xff >> count);
        x86tmp1 = _mm_srli_epi16(tmpaValue.m128i_value, count);
        x86Result.m128i_value = _mm_and_si128(x86tmp1, mask);
       
        return X86SIMDValue::ToSIMDValue(x86Result);
    }